

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.c
# Opt level: O0

void nn_hash_rehash(nn_hash *self)

{
  uint32_t uVar1;
  nn_list *ptr;
  int iVar2;
  uint32_t uVar3;
  nn_list *pnVar4;
  nn_list_item *pnVar5;
  uint uVar6;
  nn_list_item **local_38;
  uint32_t newslot;
  nn_hash_item *hitm;
  nn_list *oldarray;
  uint32_t oldslots;
  uint32_t i;
  nn_hash *self_local;
  
  uVar1 = self->slots;
  ptr = self->array;
  self->slots = self->slots << 1;
  pnVar4 = (nn_list *)nn_alloc_((ulong)self->slots << 4);
  self->array = pnVar4;
  if (self->array != (nn_list *)0x0) {
    for (oldarray._4_4_ = 0; oldarray._4_4_ != self->slots; oldarray._4_4_ = oldarray._4_4_ + 1) {
      nn_list_init(self->array + oldarray._4_4_);
    }
    for (oldarray._4_4_ = 0; oldarray._4_4_ != uVar1; oldarray._4_4_ = oldarray._4_4_ + 1) {
      while (iVar2 = nn_list_empty(ptr + oldarray._4_4_), iVar2 == 0) {
        pnVar5 = nn_list_begin(ptr + oldarray._4_4_);
        if (pnVar5 == (nn_list_item *)0x0) {
          local_38 = (nn_list_item **)0x0;
        }
        else {
          pnVar5 = nn_list_begin(ptr + oldarray._4_4_);
          local_38 = &pnVar5[-1].prev;
        }
        nn_list_erase(ptr + oldarray._4_4_,(nn_list_item *)(local_38 + 1));
        uVar3 = nn_hash_key(*(uint32_t *)local_38);
        uVar6 = uVar3 % self->slots;
        pnVar4 = self->array;
        pnVar5 = nn_list_end(self->array + uVar6);
        nn_list_insert(pnVar4 + uVar6,(nn_list_item *)(local_38 + 1),pnVar5);
      }
      nn_list_term(ptr + oldarray._4_4_);
    }
    nn_free(ptr);
    return;
  }
  fprintf(_stderr,"Out of memory (%s:%d)\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/utils/hash.c"
          ,0x43);
  fflush(_stderr);
  nn_err_abort();
}

Assistant:

static void nn_hash_rehash (struct nn_hash *self) {
    uint32_t i;
    uint32_t oldslots;
    struct nn_list *oldarray;
    struct nn_hash_item *hitm;
    uint32_t newslot;

    /*  Allocate new double-sized array of slots. */
    oldslots = self->slots;
    oldarray = self->array;
    self->slots *= 2;
    self->array = nn_alloc (sizeof (struct nn_list) * self->slots, "hash map");
    alloc_assert (self->array);
    for (i = 0; i != self->slots; ++i)
    nn_list_init (&self->array [i]);

    /*  Move the items from old slot array to new slot array. */
    for (i = 0; i != oldslots; ++i) {
    while (!nn_list_empty (&oldarray [i])) {
        hitm = nn_cont (nn_list_begin (&oldarray [i]),
                struct nn_hash_item, list);
        nn_list_erase (&oldarray [i], &hitm->list);
        newslot = nn_hash_key (hitm->key) % self->slots;
        nn_list_insert (&self->array [newslot], &hitm->list,
                nn_list_end (&self->array [newslot]));
    }

    nn_list_term (&oldarray [i]);
    }

    /*  Deallocate the old array of slots. */
    nn_free (oldarray);
}